

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O3

int mg_base64_encode(uchar *src,size_t src_len,char *dst,size_t *dst_len)

{
  byte bVar1;
  undefined1 auVar2 [16];
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  
  if (dst_len != (size_t *)0x0) {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = src_len + 2;
    uVar8 = SUB168(auVar2 * ZEXT816(0xaaaaaaaaaaaaaaab),8) * 2 & 0xfffffffffffffffc;
    if (*dst_len <= uVar8) {
      iVar3 = 0;
      if (*dst_len != 0) {
        *dst = '\0';
      }
      goto LAB_00114bf7;
    }
  }
  if (src_len == 0) {
    uVar8 = 0;
  }
  else {
    uVar8 = 0;
    uVar4 = 2;
    do {
      uVar7 = 0;
      if (uVar4 - 1 < src_len) {
        uVar7 = (uint)src[uVar4 - 1];
      }
      uVar6 = 0;
      if (uVar4 < src_len) {
        uVar6 = (uint)src[uVar4];
      }
      bVar1 = src[uVar4 - 2];
      dst[uVar8] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[bVar1 >> 2];
      dst[uVar8 + 1] =
           "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
           [uVar7 >> 4 | (bVar1 & 3) << 4];
      if (uVar4 - 1 < src_len) {
        dst[uVar8 + 2] =
             "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
             [(uVar6 >> 6) + (uVar7 & 0xf) * 4];
        uVar8 = uVar8 + 3;
      }
      else {
        uVar8 = uVar8 + 2;
      }
      if (uVar4 < src_len) {
        dst[uVar8] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                     [uVar6 & 0x3f];
        uVar8 = uVar8 + 1;
      }
      uVar5 = uVar4 + 1;
      uVar4 = uVar4 + 3;
    } while (uVar5 < src_len);
    if ((uVar8 & 3) != 0) {
      uVar4 = (ulong)((uint)uVar8 & 3);
      memset(dst + uVar8,0x3d,4 - uVar4);
      uVar8 = uVar8 + (uVar4 ^ 3) + 1;
    }
  }
  dst[uVar8] = '\0';
  iVar3 = -1;
  if (dst_len == (size_t *)0x0) {
    return -1;
  }
LAB_00114bf7:
  *dst_len = uVar8 | 1;
  return iVar3;
}

Assistant:

CIVETWEB_API int
mg_base64_encode(const unsigned char *src,
                 size_t src_len,
                 char *dst,
                 size_t *dst_len)
{
	static const char *b64 =
	    "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/";
	size_t i, j;
	int a, b, c;

	if (dst_len != NULL) {
		/* Expected length including 0 termination: */
		/* IN 1 -> OUT 5, IN 2 -> OUT 5, IN 3 -> OUT 5, IN 4 -> OUT 9,
		 * IN 5 -> OUT 9, IN 6 -> OUT 9, IN 7 -> OUT 13, etc. */
		size_t expected_len = ((src_len + 2) / 3) * 4 + 1;
		if (*dst_len < expected_len) {
			if (*dst_len > 0) {
				dst[0] = '\0';
			}
			*dst_len = expected_len;
			return 0;
		}
	}

	for (i = j = 0; i < src_len; i += 3) {
		a = src[i];
		b = ((i + 1) >= src_len) ? 0 : src[i + 1];
		c = ((i + 2) >= src_len) ? 0 : src[i + 2];

		dst[j++] = b64[a >> 2];
		dst[j++] = b64[((a & 3) << 4) | (b >> 4)];
		if (i + 1 < src_len) {
			dst[j++] = b64[(b & 15) << 2 | (c >> 6)];
		}
		if (i + 2 < src_len) {
			dst[j++] = b64[c & 63];
		}
	}
	while (j % 4 != 0) {
		dst[j++] = '=';
	}
	dst[j++] = '\0';

	if (dst_len != NULL) {
		*dst_len = (size_t)j;
	}

	/* Return -1 for "OK" */
	return -1;
}